

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot)

{
  bool bVar1;
  PointerType pSVar2;
  iterator iVar3;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_40;
  PositionType local_38;
  undefined1 local_20 [8];
  PositionType pos;
  cmState *this_local;
  
  pos.Position = (PositionType)this;
  bVar1 = Snapshot::IsValid(&originSnapshot);
  if (!bVar1) {
    __assert_fail("originSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmState.cxx"
                  ,0x2b3,"cmState::Snapshot cmState::CreateBuildsystemDirectorySnapshot(Snapshot)");
  }
  _local_20 = cmLinkedTree<cmState::SnapshotDataType>::Extend
                        (&this->SnapshotData,originSnapshot.Position);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  (pSVar2->DirectoryParent).Tree = originSnapshot.Position.Tree;
  (pSVar2->DirectoryParent).Position = originSnapshot.Position.Position;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->SnapshotType = BuildsystemDirectoryType;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Extend
                    (&this->BuildsystemDirectory,pSVar2->BuildSystemDirectory);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  local_40 = iVar3.Tree;
  (pSVar2->BuildSystemDirectory).Tree = local_40;
  local_38 = iVar3.Position;
  (pSVar2->BuildSystemDirectory).Position = local_38;
  Snapshot::Snapshot(__return_storage_ptr__,this,_local_20);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateBuildsystemDirectorySnapshot(Snapshot originSnapshot)
{
  assert(originSnapshot.IsValid());
  PositionType pos = this->SnapshotData.Extend(originSnapshot.Position);
  pos->DirectoryParent = originSnapshot.Position;
  pos->SnapshotType = BuildsystemDirectoryType;
  pos->BuildSystemDirectory =
      this->BuildsystemDirectory.Extend(
        originSnapshot.Position->BuildSystemDirectory);
  return cmState::Snapshot(this, pos);
}